

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::MakeRuntimeArrayLengthInst
          (GraphicsRobustAccessPass *this,Instruction *access_chain,uint32_t operand_index)

{
  IRContext *pIVar1;
  TypeManager *this_00;
  ConstantManager *this_01;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  array<signed_char,_4UL> aVar6;
  Instruction *this_02;
  ulong uVar7;
  Instruction *inst;
  Constant *this_03;
  uint64_t uVar8;
  undefined4 extraout_var;
  Type *pTVar9;
  undefined4 extraout_var_00;
  long lVar10;
  pointer pOVar11;
  Instruction *pIVar12;
  ulong uVar13;
  long lVar14;
  uint32_t i;
  uint uVar15;
  pointer *__ptr;
  SmallVector<unsigned_int,_2UL> *this_04;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_05;
  uint uVar16;
  Integer uint_type_for_query;
  OperandList ops;
  Instruction *local_2b8;
  undefined1 local_2a8 [32];
  undefined8 local_288;
  undefined1 local_280;
  undefined1 local_270 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_250;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_248;
  undefined1 local_230 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_210;
  undefined1 local_208 [8];
  SmallVector<unsigned_int,_2UL> SStack_200;
  undefined4 local_1d8;
  undefined1 local_1d0 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1b0;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  this_00 = (pIVar1->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  uVar15 = 2;
  local_2b8 = (Instruction *)0x0;
  pIVar12 = access_chain;
  do {
    if (pIVar12->opcode_ - OpAccessChain < 2) {
      uVar16 = operand_index - 2;
      if (pIVar12 != access_chain) {
        uVar3 = (pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar3 = (uint)pIVar12->has_result_id_;
        }
        uVar16 = ~uVar3 + (int)((ulong)((long)(pIVar12->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pIVar12->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                          -0x55555555;
      }
      uVar2 = (pIVar12->has_result_id_ & 1) + 1;
      if (pIVar12->has_type_id_ == false) {
        uVar2 = (uint)pIVar12->has_result_id_;
      }
      uVar2 = Instruction::GetSingleWordOperand(pIVar12,uVar2);
      this_02 = GetDef(this,uVar2);
      uVar3 = uVar15 - uVar16;
      if (uVar3 != 0) {
        if (uVar16 <= uVar15 && uVar3 != 0) goto LAB_0021dc1c;
        local_208 = (undefined1  [8])0x0;
        SStack_200._vptr_SmallVector = (_func_int **)0x0;
        SStack_200.size_ = 0;
        pOVar11 = (pIVar12->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(pIVar12->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar11 >> 4) *
                   -0x5555555555555555) < 3) {
LAB_0021df67:
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_208,pOVar11 + 2);
        uVar3 = 0;
        do {
          uVar7 = (ulong)(uVar3 + 3);
          pOVar11 = (pIVar12->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar13 = ((long)(pIVar12->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar11 >> 4) *
                   -0x5555555555555555;
          if (uVar13 < uVar7 || uVar13 - uVar7 == 0) goto LAB_0021df67;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_208,pOVar11 + uVar7);
          uVar3 = uVar3 + 1;
        } while (uVar3 <= uVar16 + ~uVar15);
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
          IRContext::BuildConstantManager(pIVar1);
        }
        this_01 = (pIVar1->constant_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                  _M_head_impl;
        local_2a8._0_8_ = (_func_int **)0x0;
        local_2a8._8_8_ = (pointer)0x0;
        local_2a8._16_8_ = (pointer)0x0;
        if ((long)SStack_200._vptr_SmallVector - (long)local_208 != 0x30) {
          uVar2 = 3;
          do {
            local_270._0_8_ = local_270._0_8_ & 0xffffffff00000000;
            uVar5 = Instruction::GetSingleWordOperand(pIVar12,uVar2);
            inst = GetDef(this,uVar5);
            this_03 = analysis::ConstantManager::GetConstantFromInst(this_01,inst);
            if (this_03 == (Constant *)0x0) {
              uVar15 = 0;
            }
            else {
              uVar8 = analysis::Constant::GetZeroExtendedValue(this_03);
              uVar15 = (uint)uVar8;
            }
            local_270._0_4_ = uVar15;
            if (local_2a8._8_8_ == local_2a8._16_8_) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_2a8,
                         (iterator)local_2a8._8_8_,(uint *)local_270);
            }
            else {
              *(uint *)local_2a8._8_8_ = uVar15;
              local_2a8._8_8_ = local_2a8._8_8_ + 4;
            }
            uVar15 = uVar2 - 2;
            uVar2 = uVar2 + 1;
          } while ((ulong)uVar15 <
                   ((long)SStack_200._vptr_SmallVector - (long)local_208 >> 4) * -0x5555555555555555
                   - 1U);
        }
        uVar2 = 0;
        if (this_02->has_type_id_ == true) {
          uVar2 = Instruction::GetSingleWordOperand(this_02,0);
        }
        pTVar9 = analysis::TypeManager::GetType(this_00,uVar2);
        iVar4 = (*pTVar9->_vptr_Type[0x1f])(pTVar9);
        pTVar9 = analysis::TypeManager::GetMemberType
                           (this_00,*(Type **)(CONCAT44(extraout_var,iVar4) + 0x28),
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a8);
        uVar2 = analysis::TypeManager::GetId(this_00,pTVar9);
        uVar2 = analysis::TypeManager::FindPointerToType
                          (this_00,uVar2,*(StorageClass *)(CONCAT44(extraout_var,iVar4) + 0x30));
        uVar5 = Pass::TakeNextId(&this->super_Pass);
        this_02 = InsertInst(this,pIVar12,pIVar12->opcode_,uVar2,uVar5,
                             (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              *)local_208);
        if ((_func_int **)local_2a8._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ - local_2a8._0_8_);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_208);
      }
      local_2b8 = this_02;
      this_02 = pIVar12;
      uVar3 = 0;
    }
    else {
      if (pIVar12->opcode_ != OpCopyObject) {
        Fail((DiagnosticStream *)local_208,this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   "Unhandled access chain in logical addressing mode passes through ",0x41);
        Instruction::PrettyPrint_abi_cxx11_((string *)local_2a8,pIVar12,0x50);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_2a8._0_8_,local_2a8._8_8_);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        return (Instruction *)0x0;
      }
      uVar2 = (pIVar12->has_result_id_ & 1) + 1;
      if (pIVar12->has_type_id_ == false) {
        uVar2 = (uint)pIVar12->has_result_id_;
      }
      uVar2 = Instruction::GetSingleWordOperand(pIVar12,uVar2);
      this_02 = GetDef(this,uVar2);
      uVar3 = uVar15;
    }
LAB_0021dc1c:
    uVar15 = uVar3;
    pIVar12 = this_02;
    if (uVar15 == 0) {
      if (local_2b8 != (Instruction *)0x0) {
        aVar6._M_elems[0] = '\0';
        aVar6._M_elems[1] = '\0';
        aVar6._M_elems[2] = '\0';
        aVar6._M_elems[3] = '\0';
        uVar2 = 0;
        if (local_2b8->has_type_id_ == true) {
          uVar2 = Instruction::GetSingleWordOperand(local_2b8,0);
        }
        pTVar9 = analysis::TypeManager::GetType(this_00,uVar2);
        iVar4 = (*pTVar9->_vptr_Type[0x1f])(pTVar9);
        lVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar4) + 0x28) + 0xe0))();
        lVar14 = *(long *)(lVar10 + 0x30);
        lVar10 = *(long *)(lVar10 + 0x28);
        uVar2 = Pass::TakeNextId(&this->super_Pass);
        local_2a8._8_8_ = (pointer)0x0;
        local_2a8._16_8_ = (pointer)0x0;
        local_2a8._24_8_ = (pointer)0x0;
        local_288._0_4_ = kInteger;
        local_288._4_4_ = 0x20;
        local_2a8._0_8_ = &PTR__Type_003ed780;
        local_280 = 0;
        pTVar9 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_2a8);
        uVar5 = analysis::TypeManager::GetId(this_00,pTVar9);
        if (local_2b8->has_result_id_ == true) {
          aVar6._M_elems =
               (_Type)Instruction::GetSingleWordOperand(local_2b8,(uint)local_2b8->has_type_id_);
        }
        local_270._24_8_ = local_270 + 0x10;
        local_270._0_8_ = &PTR__SmallVector_003e9b28;
        local_250._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_270._8_8_ = 1;
        this_04 = &SStack_200;
        local_208._0_4_ = 1;
        SStack_200._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
        SStack_200.size_ = 0;
        SStack_200.small_data_ = (uint *)SStack_200.buffer;
        SStack_200.large_data_._M_t.
        super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_270._16_4_ = aVar6._M_elems;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (this_04,(SmallVector<unsigned_int,_2UL> *)local_270);
        local_230._24_8_ = local_230 + 0x10;
        local_230._0_8_ = &PTR__SmallVector_003e9b28;
        local_210._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_230._8_8_ = 1;
        local_1d8 = 6;
        local_1d0._0_8_ = &PTR__SmallVector_003e9b28;
        local_1d0._8_8_ = 0;
        local_1d0._24_8_ = local_1d0 + 0x10;
        local_1b0._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_230._16_4_ = (int)((ulong)(lVar14 - lVar10) >> 3) + -1;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)local_1d0,
                   (SmallVector<unsigned_int,_2UL> *)local_230);
        local_248.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_248.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_248.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar14 = 0x60;
        pOVar11 = (pointer)operator_new(0x60);
        local_248.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pOVar11 + 2;
        local_248.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_start = pOVar11;
        do {
          pOVar11->type =
               *(spv_operand_type_t *)
                &this_04[-1].large_data_._M_t.
                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl;
          (pOVar11->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
          (pOVar11->words).size_ = 0;
          (pOVar11->words).small_data_ = (uint *)(pOVar11->words).buffer;
          (pOVar11->words).large_data_._M_t.
          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar11->words,this_04);
          pOVar11 = pOVar11 + 1;
          this_04 = (SmallVector<unsigned_int,_2UL> *)&this_04[1].size_;
          lVar14 = lVar14 + -0x30;
        } while (lVar14 != 0);
        local_248.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_finish = pOVar11;
        pIVar12 = InsertInst(this,access_chain,OpArrayLength,uVar5,uVar2,&local_248);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_248);
        lVar14 = -0x60;
        this_05 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                  &local_1b0;
        do {
          *(undefined ***)(this_05 + -0x20) = &PTR__SmallVector_003e9b28;
          if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_05 !=
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()(this_05,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_05);
          }
          *(undefined8 *)this_05 = 0;
          this_05 = this_05 + -0x30;
          lVar14 = lVar14 + 0x30;
        } while (lVar14 != 0);
        local_230._0_8_ = &PTR__SmallVector_003e9b28;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_210._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
        {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_210,local_210._M_head_impl);
        }
        local_270._0_8_ = &PTR__SmallVector_003e9b28;
        if (local_250._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_250,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     local_250._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl);
        }
        local_2a8._0_8_ = &PTR__Type_003e9e18;
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)(local_2a8 + 8));
        return pIVar12;
      }
      __assert_fail("pointer_to_containing_struct",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                    ,0x308,
                    "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeRuntimeArrayLengthInst(Instruction *, uint32_t)"
                   );
    }
  } while( true );
}

Assistant:

Instruction* GraphicsRobustAccessPass::MakeRuntimeArrayLengthInst(
    Instruction* access_chain, uint32_t operand_index) {
  // The Index parameter to the access chain at |operand_index| is indexing
  // *into* the runtime-array.  To get the number of elements in the runtime
  // array we need a pointer to the Block-decorated struct that contains the
  // runtime array. So conceptually we have to go 2 steps backward in the
  // access chain.  The two steps backward might forces us to traverse backward
  // across multiple dominating instructions.
  auto* type_mgr = context()->get_type_mgr();

  // How many access chain indices do we have to unwind to find the pointer
  // to the struct containing the runtime array?
  uint32_t steps_remaining = 2;
  // Find or create an instruction computing the pointer to the structure
  // containing the runtime array.
  // Walk backward through pointer address calculations until we either get
  // to exactly the right base pointer, or to an access chain instruction
  // that we can replicate but truncate to compute the address of the right
  // struct.
  Instruction* current_access_chain = access_chain;
  Instruction* pointer_to_containing_struct = nullptr;
  while (steps_remaining > 0) {
    switch (current_access_chain->opcode()) {
      case spv::Op::OpCopyObject:
        // Whoops. Walk right through this one.
        current_access_chain =
            GetDef(current_access_chain->GetSingleWordInOperand(0));
        break;
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain: {
        const int first_index_operand = 3;
        // How many indices in this access chain contribute to getting us
        // to an element in the runtime array?
        const auto num_contributing_indices =
            current_access_chain == access_chain
                ? operand_index - (first_index_operand - 1)
                : current_access_chain->NumInOperands() - 1 /* skip the base */;
        Instruction* base =
            GetDef(current_access_chain->GetSingleWordInOperand(0));
        if (num_contributing_indices == steps_remaining) {
          // The base pointer points to the structure.
          pointer_to_containing_struct = base;
          steps_remaining = 0;
          break;
        } else if (num_contributing_indices < steps_remaining) {
          // Peel off the index and keep going backward.
          steps_remaining -= num_contributing_indices;
          current_access_chain = base;
        } else {
          // This access chain has more indices than needed.  Generate a new
          // access chain instruction, but truncating the list of indices.
          const int base_operand = 2;
          // We'll use the base pointer and the indices up to but not including
          // the one indexing into the runtime array.
          Instruction::OperandList ops;
          // Use the base pointer
          ops.push_back(current_access_chain->GetOperand(base_operand));
          const uint32_t num_indices_to_keep =
              num_contributing_indices - steps_remaining - 1;
          for (uint32_t i = 0; i <= num_indices_to_keep; i++) {
            ops.push_back(
                current_access_chain->GetOperand(first_index_operand + i));
          }
          // Compute the type of the result of the new access chain.  Start at
          // the base and walk the indices in a forward direction.
          auto* constant_mgr = context()->get_constant_mgr();
          std::vector<uint32_t> indices_for_type;
          for (uint32_t i = 0; i < ops.size() - 1; i++) {
            uint32_t index_for_type_calculation = 0;
            Instruction* index =
                GetDef(current_access_chain->GetSingleWordOperand(
                    first_index_operand + i));
            if (auto* index_constant =
                    constant_mgr->GetConstantFromInst(index)) {
              // We only need 32 bits. For the type calculation, it's sufficient
              // to take the zero-extended value. It only matters for the struct
              // case, and struct member indices are unsigned.
              index_for_type_calculation =
                  uint32_t(index_constant->GetZeroExtendedValue());
            } else {
              // Indexing into a variably-sized thing like an array.  Use 0.
              index_for_type_calculation = 0;
            }
            indices_for_type.push_back(index_for_type_calculation);
          }
          auto* base_ptr_type = type_mgr->GetType(base->type_id())->AsPointer();
          auto* base_pointee_type = base_ptr_type->pointee_type();
          auto* new_access_chain_result_pointee_type =
              type_mgr->GetMemberType(base_pointee_type, indices_for_type);
          const uint32_t new_access_chain_type_id = type_mgr->FindPointerToType(
              type_mgr->GetId(new_access_chain_result_pointee_type),
              base_ptr_type->storage_class());

          // Create the instruction and insert it.
          const auto new_access_chain_id = TakeNextId();
          auto* new_access_chain =
              InsertInst(current_access_chain, current_access_chain->opcode(),
                         new_access_chain_type_id, new_access_chain_id, ops);
          pointer_to_containing_struct = new_access_chain;
          steps_remaining = 0;
          break;
        }
      } break;
      default:
        Fail() << "Unhandled access chain in logical addressing mode passes "
                  "through "
               << current_access_chain->PrettyPrint(
                      SPV_BINARY_TO_TEXT_OPTION_SHOW_BYTE_OFFSET |
                      SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
        return nullptr;
    }
  }
  assert(pointer_to_containing_struct);
  auto* pointee_type =
      type_mgr->GetType(pointer_to_containing_struct->type_id())
          ->AsPointer()
          ->pointee_type();

  auto* struct_type = pointee_type->AsStruct();
  const uint32_t member_index_of_runtime_array =
      uint32_t(struct_type->element_types().size() - 1);
  // Create the length-of-array instruction before the original access chain,
  // but after the generation of the pointer to the struct.
  const auto array_len_id = TakeNextId();
  analysis::Integer uint_type_for_query(32, false);
  auto* uint_type = type_mgr->GetRegisteredType(&uint_type_for_query);
  auto* array_len = InsertInst(
      access_chain, spv::Op::OpArrayLength, type_mgr->GetId(uint_type),
      array_len_id,
      {{SPV_OPERAND_TYPE_ID, {pointer_to_containing_struct->result_id()}},
       {SPV_OPERAND_TYPE_LITERAL_INTEGER, {member_index_of_runtime_array}}});
  return array_len;
}